

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

StructuredAssignmentPatternExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
          (BumpAllocator *this,Type *args,
          span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
          *args_1,span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                  *args_2,
          span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
          *args_3,Expression **args_4,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_5,SourceRange *args_6)

{
  Expression *pEVar1;
  pointer pMVar2;
  size_t sVar3;
  pointer pTVar4;
  size_t sVar5;
  pointer pIVar6;
  size_t sVar7;
  pointer ppEVar8;
  size_t sVar9;
  SourceLocation SVar10;
  SourceLocation SVar11;
  StructuredAssignmentPatternExpression *pSVar12;
  
  pSVar12 = (StructuredAssignmentPatternExpression *)allocate(this,0x78,8);
  pMVar2 = args_1->_M_ptr;
  sVar3 = (args_1->_M_extent)._M_extent_value;
  pTVar4 = args_2->_M_ptr;
  sVar5 = (args_2->_M_extent)._M_extent_value;
  pIVar6 = args_3->_M_ptr;
  sVar7 = (args_3->_M_extent)._M_extent_value;
  pEVar1 = *args_4;
  ppEVar8 = args_5->_M_ptr;
  sVar9 = (args_5->_M_extent)._M_extent_value;
  SVar10 = args_6->startLoc;
  SVar11 = args_6->endLoc;
  (pSVar12->super_AssignmentPatternExpressionBase).super_Expression.kind =
       StructuredAssignmentPattern;
  (pSVar12->super_AssignmentPatternExpressionBase).super_Expression.type.ptr = args;
  (pSVar12->super_AssignmentPatternExpressionBase).super_Expression.constant = (ConstantValue *)0x0;
  (pSVar12->super_AssignmentPatternExpressionBase).super_Expression.syntax = (ExpressionSyntax *)0x0
  ;
  (pSVar12->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc = SVar10;
  (pSVar12->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc = SVar11;
  (pSVar12->super_AssignmentPatternExpressionBase).elements_._M_ptr = ppEVar8;
  (pSVar12->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value = sVar9;
  (pSVar12->memberSetters)._M_ptr = pMVar2;
  (pSVar12->memberSetters)._M_extent._M_extent_value = sVar3;
  (pSVar12->typeSetters)._M_ptr = pTVar4;
  (pSVar12->typeSetters)._M_extent._M_extent_value = sVar5;
  (pSVar12->indexSetters)._M_ptr = pIVar6;
  (pSVar12->indexSetters)._M_extent._M_extent_value = sVar7;
  pSVar12->defaultSetter = pEVar1;
  return pSVar12;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }